

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxWriterDOTFormat.cpp
# Opt level: O2

ssize_t __thiscall
psy::C::SyntaxWriterDOTFormat::write(SyntaxWriterDOTFormat *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  void *__buf_00;
  string basename;
  ofstream ofs;
  
  SyntaxTree::filePath_abi_cxx11_(&basename,(this->super_SyntaxDumper).super_SyntaxVisitor.tree_);
  std::__cxx11::string::append((string *)&basename);
  std::ofstream::ofstream(&ofs,(string *)&basename,_S_out);
  write(this,__fd,__buf_00,(size_t)&ofs);
  std::ofstream::close();
  std::ofstream::~ofstream(&ofs);
  sVar1 = std::__cxx11::string::~string((string *)&basename);
  return sVar1;
}

Assistant:

void SyntaxWriterDOTFormat::write(const SyntaxNode* node,
                                  const std::string& fileSuffix)
{
    std::string basename = tree_->filePath();
    basename.append(fileSuffix);
    std::ofstream ofs(basename);
    write(node, fileSuffix, ofs);
    ofs.close();
}